

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O1

void sptk::snack::xautoc(int windowsize,float *s,int p,float *r,float *e)

{
  long lVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = 0.0;
  if (windowsize != 0) {
    lVar1 = 0;
    do {
      fVar6 = fVar6 + s[lVar1] * s[lVar1];
      lVar1 = lVar1 + 1;
    } while (windowsize != (int)lVar1);
  }
  *r = 1.0;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar5 = fVar6 / (float)windowsize;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    *e = fVar5;
    if (0 < p) {
      pfVar2 = s + 1;
      iVar4 = windowsize + -1;
      uVar3 = 1;
      do {
        fVar5 = 0.0;
        if (windowsize != (int)uVar3) {
          lVar1 = 0;
          do {
            fVar5 = fVar5 + s[lVar1] * pfVar2[lVar1];
            lVar1 = lVar1 + 1;
          } while (iVar4 != (int)lVar1);
        }
        r[1] = fVar5 * (1.0 / fVar6);
        r = r + 1;
        uVar3 = uVar3 + 1;
        pfVar2 = pfVar2 + 1;
        iVar4 = iVar4 + -1;
      } while (uVar3 != p + 1);
    }
  }
  else {
    *e = 1.0;
    if (0 < p) {
      memset(r + 1,0,(ulong)(uint)p << 2);
      return;
    }
  }
  return;
}

Assistant:

void xautoc(int windowsize, float *s, int p, float *r, float *e)
#endif
{
  register int i, j;
  register float *q, *t, sum, sum0;

  for( i=windowsize, q=s, sum0=0.0; i--;) {
    sum = *q++;
    sum0 += sum*sum;
  }
  *r = 1.;			/* r[0] will always =1. */
  if(sum0 == 0.0) {		/* No energy: fake low-energy white noise. */
    *e = 1.;			/* Arbitrarily assign 1 to rms. */
    /* Now fake autocorrelation of white noise. */
    for ( i=1; i<=p; i++){
      r[i] = 0.;
    }
    return;
  }
  *e = (float) sqrt((double)(sum0/windowsize));
  sum0 = (float) (1.0/sum0);
  for( i=1; i <= p; i++){
    for( sum=0.0, j=windowsize-i, q=s, t=s+i; j--; )
      sum += (*q++) * (*t++);
    *(++r) = sum*sum0;
  }
}